

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

int __thiscall cppcms::http::context::translate_exception(context *this)

{
  char cVar1;
  int iVar2;
  level_type lVar3;
  abort_upload *this_00;
  exception *e;
  ostream *poVar4;
  undefined1 auVar5 [12];
  message local_40 [48];
  
  auVar5 = __cxa_rethrow();
  if (auVar5._8_4_ == 3) {
    this_00 = (abort_upload *)__cxa_begin_catch(auVar5._0_8_);
    iVar2 = abort_upload::code(this_00);
    __cxa_end_catch();
  }
  else {
    e = (exception *)__cxa_begin_catch(auVar5._0_8_);
    if (auVar5._8_4_ == 2) {
      make_error_message(this,e);
    }
    else {
      lVar3 = booster::log::logger::instance();
      cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
      if (cVar1 != '\0') {
        booster::log::message::message
                  (local_40,error,"cppcms",
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
                   ,0xd7);
        poVar4 = (ostream *)booster::log::message::out();
        std::operator<<(poVar4,"Unknown exception");
        booster::log::message::~message(local_40);
      }
    }
    __cxa_end_catch();
    iVar2 = 500;
  }
  return iVar2;
}

Assistant:

int context::translate_exception()
{
	try {
		throw;
	}
	catch(abort_upload const &e) {
		return e.code();
	}
	catch(std::exception const &e) {
		make_error_message(e);
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception";
		return 500;
	}
	return 0;
}